

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_Mesh.cpp
# Opt level: O2

void __thiscall Nova::Simplex_Mesh<3>::Initialize_Neighbor_Nodes(Simplex_Mesh<3> *this)

{
  size_t m;
  Array<Nova::Array<int>_> *pAVar1;
  Vector<int,_3,_true> *this_00;
  int *piVar2;
  Array<int> *this_01;
  int i;
  int i_00;
  int j;
  int i_01;
  size_t t;
  ulong uVar3;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  pAVar1 = this->neighbor_nodes;
  if (pAVar1 != (Array<Nova::Array<int>_> *)0x0) {
    std::vector<Nova::Array<int>,_std::allocator<Nova::Array<int>_>_>::~vector(&pAVar1->_data);
    operator_delete(pAVar1);
  }
  pAVar1 = (Array<Nova::Array<int>_> *)operator_new(0x18);
  m = this->number_of_nodes;
  local_4c = 0;
  Array<int>::Array((Array<int> *)&local_48,0,&local_4c);
  Array<Nova::Array<int>_>::Array(pAVar1,m,(Array<int> *)&local_48);
  this->neighbor_nodes = pAVar1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->elements)._data.
                             super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->elements)._data.
                            super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar3 = uVar3 + 1) {
    this_00 = Array<Nova::Vector<int,_3,_true>_>::operator()(&this->elements,(int)uVar3);
    for (i_00 = 0; i_00 != 3; i_00 = i_00 + 1) {
      for (i_01 = 0; i_01 != 3; i_01 = i_01 + 1) {
        if (i_00 != i_01) {
          pAVar1 = this->neighbor_nodes;
          piVar2 = Vector<int,_3,_true>::operator[](this_00,i_00);
          this_01 = Array<Nova::Array<int>_>::operator()(pAVar1,*piVar2);
          piVar2 = Vector<int,_3,_true>::operator[](this_00,i_01);
          Array<int>::Append_Unique(this_01,piVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void Nova::Simplex_Mesh<d>::
Initialize_Neighbor_Nodes()
{
    if(neighbor_nodes!=nullptr) delete neighbor_nodes;
    neighbor_nodes=new Array<Array<int>>(number_of_nodes);
    for(size_t t=0;t<elements.size();++t){const INDEX& element=elements(t);
        for(int i=0;i<d;++i) for(int j=0;j<d;++j) if(i!=j) (*neighbor_nodes)(element[i]).Append_Unique(element[j]);}
}